

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dealDoubleEdge(void)

{
  int iVar1;
  FILE *pFVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  ulong local_38;
  size_t i_1;
  size_t last;
  size_t cur;
  ulong local_10;
  size_t i;
  
  pFVar2 = _stderr;
  sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&edges);
  fprintf(pFVar2,"number of edges before dealDoubleEdge: %lu\n",sVar4);
  for (local_10 = 0;
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&edges),
      local_10 < sVar4; local_10 = local_10 + 1) {
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&edges,local_10);
    iVar1 = pvVar5->first;
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&edges,local_10);
    if (pvVar5->second < iVar1) {
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&edges,local_10);
      pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&edges,local_10);
      std::swap<int>(&pvVar5->first,&pvVar6->second);
    }
  }
  __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(&edges);
  __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(&edges);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__last._M_current);
  last = 1;
  i_1 = 0;
  for (local_38 = 1;
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&edges),
      local_38 < sVar4; local_38 = local_38 + 1) {
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&edges,local_38);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&edges,i_1);
    bVar3 = std::operator!=(pvVar5,pvVar6);
    if (bVar3) {
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&edges,local_38);
      pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&edges,last);
      std::pair<int,_int>::operator=(pvVar6,pvVar5);
      last = last + 1;
    }
    i_1 = local_38;
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&edges,last);
  pFVar2 = _stderr;
  sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&edges);
  fprintf(pFVar2,"number of edges after dealDoubleEdge: %lu\n",sVar4);
  return;
}

Assistant:

void dealDoubleEdge() {
	fprintf(stderr, "number of edges before dealDoubleEdge: %lu\n", edges.size());
	// 排序
	for (size_t i = 0; i < edges.size(); i++) {
		if (edges[i].first > edges[i].second) swap(edges[i].first, edges[i].second);
	}
	sort(edges.begin(), edges.end());
	// 去重
	size_t cur = 1;
	for (size_t last = 0, i = 1; i < edges.size(); ++i, last = i-1) {
		if (edges[i] != edges[last]) {
			edges[cur++] = edges[i];
		}
	}
	edges.resize(cur);
	fprintf(stderr, "number of edges after dealDoubleEdge: %lu\n", edges.size());
}